

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O0

int libssh2_knownhost_readline(LIBSSH2_KNOWNHOSTS *hosts,char *line,size_t len,int type)

{
  char *host;
  char *key;
  size_t hostlen_00;
  bool bVar1;
  size_t sStack_58;
  int rc;
  size_t keylen;
  size_t hostlen;
  char *keyp;
  char *hostp;
  char *cp;
  size_t sStack_28;
  int type_local;
  size_t len_local;
  char *line_local;
  LIBSSH2_KNOWNHOSTS *hosts_local;
  
  hostp = line;
  sStack_28 = len;
  if (type == 1) {
    while( true ) {
      host = hostp;
      bVar1 = false;
      if ((sStack_28 != 0) && (bVar1 = true, *hostp != ' ')) {
        bVar1 = *hostp == '\t';
      }
      if (!bVar1) break;
      hostp = hostp + 1;
      sStack_28 = sStack_28 - 1;
    }
    if ((((sStack_28 == 0) || (*hostp == '\0')) || (*hostp == '#')) || (*hostp == '\n')) {
      hosts_local._4_4_ = 0;
    }
    else {
      while( true ) {
        bVar1 = false;
        if (((sStack_28 != 0) && (bVar1 = false, *hostp != '\0')) && (bVar1 = false, *hostp != ' '))
        {
          bVar1 = *hostp != '\t';
        }
        if (!bVar1) break;
        hostp = hostp + 1;
        sStack_28 = sStack_28 - 1;
      }
      hostlen_00 = (long)hostp - (long)host;
      while( true ) {
        sStack_58 = sStack_28;
        key = hostp;
        bVar1 = false;
        if (((sStack_28 != 0) && (bVar1 = false, *hostp != '\0')) && (bVar1 = true, *hostp != ' '))
        {
          bVar1 = *hostp == '\t';
        }
        if (!bVar1) break;
        hostp = hostp + 1;
        sStack_28 = sStack_28 - 1;
      }
      if ((*hostp == '\0') || (sStack_28 == 0)) {
        hosts_local._4_4_ = _libssh2_error(hosts->session,-0x21,"Failed to parse known_hosts line");
      }
      else {
        while( true ) {
          bVar1 = false;
          if ((sStack_28 != 0) && (bVar1 = false, *hostp != '\0')) {
            bVar1 = *hostp != '\n';
          }
          if (!bVar1) break;
          hostp = hostp + 1;
          sStack_28 = sStack_28 - 1;
        }
        if (*hostp == '\n') {
          sStack_58 = sStack_58 - 1;
        }
        hosts_local._4_4_ = hostline(hosts,host,hostlen_00,key,sStack_58);
        if (hosts_local._4_4_ == 0) {
          hosts_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    hosts_local._4_4_ =
         _libssh2_error(hosts->session,-0x21,"Unsupported type of known-host information store");
  }
  return hosts_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_knownhost_readline(LIBSSH2_KNOWNHOSTS *hosts,
                           const char *line, size_t len, int type)
{
    const char *cp;
    const char *hostp;
    const char *keyp;
    size_t hostlen;
    size_t keylen;
    int rc;

    if(type != LIBSSH2_KNOWNHOST_FILE_OPENSSH)
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Unsupported type of known-host information "
                              "store");

    cp = line;

    /* skip leading whitespaces */
    while(len && ((*cp == ' ') || (*cp == '\t'))) {
        cp++;
        len--;
    }

    if(!len || !*cp || (*cp == '#') || (*cp == '\n'))
        /* comment or empty line */
        return LIBSSH2_ERROR_NONE;

    /* the host part starts here */
    hostp = cp;

    /* move over the host to the separator */
    while(len && *cp && (*cp != ' ') && (*cp != '\t')) {
        cp++;
        len--;
    }

    hostlen = cp - hostp;

    /* the key starts after the whitespaces */
    while(len && *cp && ((*cp == ' ') || (*cp == '\t'))) {
        cp++;
        len--;
    }

    if(!*cp || !len) /* illegal line */
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Failed to parse known_hosts line");

    keyp = cp; /* the key starts here */
    keylen = len;

    /* check if the line (key) ends with a newline and if so kill it */
    while(len && *cp && (*cp != '\n')) {
        cp++;
        len--;
    }

    /* zero terminate where the newline is */
    if(*cp == '\n')
        keylen--; /* don't include this in the count */

    /* deal with this one host+key line */
    rc = hostline(hosts, hostp, hostlen, keyp, keylen);
    if(rc)
        return rc; /* failed */

    return LIBSSH2_ERROR_NONE; /* success */
}